

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

Vec_Str_t *
Bmc_CollapseOneOld(Gia_Man_t *p,int nCubeLim,int nBTLimit,int fCanon,int fReverse,int fVerbose)

{
  Vec_Int_t *pVVar1;
  Vec_Str_t *pVVar2;
  sat_solver *psVar3;
  char Entry;
  uint nCap;
  int iVar4;
  int iVar5;
  int iVar6;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  abctime aVar7;
  int *piVar8;
  int *end;
  char *pStr;
  int local_100;
  int fProfile;
  int fComplete [2];
  abctime Time [2] [2];
  long local_d0;
  abctime clk;
  int status;
  int Start;
  int iCube;
  int iCiVarBeg;
  int iLit;
  int iVar;
  int v;
  int n;
  Vec_Int_t *vCube;
  Vec_Int_t *vNums;
  Vec_Int_t *vLits;
  Vec_Int_t *vVars;
  Vec_Int_t *vLitsC [2];
  Vec_Str_t *local_70;
  Vec_Str_t *vRes;
  Vec_Str_t *vSop [2];
  sat_solver *pSatClean [2];
  sat_solver *pSat [2];
  Cnf_Dat_t *pCnf;
  int nVars;
  int fVeryVerbose;
  int fVerbose_local;
  int fReverse_local;
  int fCanon_local;
  int nBTLimit_local;
  int nCubeLim_local;
  Gia_Man_t *p_local;
  
  nCap = Gia_ManCiNum(p);
  p_00 = (Cnf_Dat_t *)Mf_ManGenerateCnf(p,8,0,0,0,0);
  pSatClean[1] = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  vSop[1] = (Vec_Str_t *)Cnf_DataWriteIntoSolver(p_00,1,0);
  pSatClean[0] = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  vRes = Vec_StrAlloc(1000);
  vSop[0] = Vec_StrAlloc(1000);
  local_70 = (Vec_Str_t *)0x0;
  vVars = Vec_IntAlloc(nCap);
  vLitsC[0] = Vec_IntAlloc(nCap);
  vLits = Vec_IntAlloc(nCap);
  vNums = Vec_IntAlloc(nCap);
  vCube = Vec_IntAlloc(nCap);
  _v = Vec_IntAlloc(nCap);
  status = 0;
  local_d0 = 0;
  memset(fComplete,0,0x20);
  memset(&local_100,0,8);
  iVar4 = p_00->nVars - nCap;
  if (fReverse == 0) {
    for (iLit = 0; iLit < (int)nCap; iLit = iLit + 1) {
      Vec_IntPush(vLits,iVar4 + iLit);
    }
  }
  else {
    for (iLit = nCap - 1; -1 < iLit; iLit = iLit + -1) {
      Vec_IntPush(vLits,iVar4 + iLit);
    }
  }
  for (iVar = 0; iVar < 2; iVar = iVar + 1) {
    iCube = Abc_Var2Lit(1,iVar);
    iVar4 = sat_solver_solve(pSatClean[(long)iVar + 1],&iCube,&iCiVarBeg,(long)nBTLimit,0,0,0);
    if (iVar4 == 0) goto LAB_006e3fee;
    if (iVar4 == -1) {
      Vec_StrClear(vRes);
      pStr = " 0\n";
      if (iVar != 0) {
        pStr = " 1\n";
      }
      Vec_StrPrintStr(vRes,pStr);
      Vec_StrPush(vRes,'\0');
      local_100 = 1;
      goto LAB_006e3fee;
    }
    for (iLit = 0; iVar4 = iLit, iVar5 = Vec_IntSize(vLits), iVar4 < iVar5; iLit = iLit + 1) {
      iCiVarBeg = Vec_IntEntry(vLits,iLit);
      pVVar1 = vLitsC[(long)iVar + -1];
      iVar4 = Abc_Var2Lit(iCiVarBeg,1);
      Vec_IntPush(pVVar1,iVar4);
    }
    iVar4 = sat_solver_addclause(pSatClean[(long)iVar + 1],&iCube,&iCiVarBeg);
    if (iVar4 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x38e,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
    }
    iVar4 = sat_solver_addclause((sat_solver *)vSop[(long)iVar + 1],&iCube,&iCiVarBeg);
    if (iVar4 == 0) {
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                    ,0x390,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
    }
    Vec_StrPush(vSop[(long)iVar + -1],'\0');
  }
  for (status = 0; nCubeLim == 0 || status < nCubeLim; status = status + 1) {
    for (iVar = 0; iVar < 2; iVar = iVar + 1) {
      if (fVerbose != 0) {
        local_d0 = Abc_Clock();
      }
      if (fCanon == 0) {
        psVar3 = pSatClean[(long)iVar + 1];
        piVar8 = Vec_IntArray(vLits);
        iVar4 = Vec_IntSize(vLits);
        sat_solver_clean_polarity(psVar3,piVar8,iVar4);
        clk._0_4_ = sat_solver_solve(pSatClean[(long)iVar + 1],(lit *)0x0,(lit *)0x0,0,0,0,0);
      }
      else {
        clk._0_4_ = Bmc_ComputeCanonical
                              (pSatClean[(long)iVar + 1],vLitsC[(long)iVar + -1],_v,nBTLimit);
      }
      if (fVerbose != 0) {
        aVar7 = Abc_Clock();
        Time[(long)iVar + -1][1] = (aVar7 - local_d0) + Time[(long)iVar + -1][1];
      }
      if ((int)clk == 0) goto LAB_006e3fee;
      if ((int)clk == -1) {
        (&local_100)[iVar] = 1;
        break;
      }
      Vec_IntClear(vNums);
      Vec_IntClear(vLitsC[(long)iVar + -1]);
      for (iLit = 0; iVar4 = iLit, iVar5 = Vec_IntSize(vLits), iVar4 < iVar5; iLit = iLit + 1) {
        iVar4 = Vec_IntEntry(vLits,iLit);
        iCiVarBeg = iVar4;
        iVar5 = sat_solver_var_value(pSatClean[(long)iVar + 1],iVar4);
        iCube = Abc_Var2Lit(iVar4,(uint)((iVar5 != 0 ^ 0xffU) & 1));
        Vec_IntPush(vNums,iCube);
        Vec_IntPush(vLitsC[(long)iVar + -1],iCube);
      }
      if (fVerbose != 0) {
        local_d0 = Abc_Clock();
      }
      iVar4 = Bmc_CollapseExpand((sat_solver *)vSop[(long)(int)(uint)((iVar != 0 ^ 0xffU) & 1) + 1],
                                 pSatClean[(long)iVar + 1],vNums,vCube,_v,nBTLimit,fCanon,-1);
      if (fVerbose != 0) {
        aVar7 = Abc_Clock();
        Time[iVar][0] = (aVar7 - local_d0) + Time[iVar][0];
      }
      if (iVar4 < 0) goto LAB_006e3fee;
      Vec_StrPop(vSop[(long)iVar + -1]);
      iVar4 = Vec_StrSize(vSop[(long)iVar + -1]);
      Vec_StrFillExtra(vSop[(long)iVar + -1],iVar4 + nCap + 4,'-');
      Vec_StrWriteEntry(vSop[(long)iVar + -1],iVar4 + nCap,' ');
      Entry = '1';
      if (iVar != 0) {
        Entry = '0';
      }
      Vec_StrWriteEntry(vSop[(long)iVar + -1],iVar4 + nCap + 1,Entry);
      Vec_StrWriteEntry(vSop[(long)iVar + -1],iVar4 + nCap + 2,'\n');
      Vec_StrWriteEntry(vSop[(long)iVar + -1],iVar4 + nCap + 3,'\0');
      Vec_IntClear(_v);
      for (iLit = 0; iVar5 = iLit, iVar6 = Vec_IntSize(vCube), iVar5 < iVar6; iLit = iLit + 1) {
        iCiVarBeg = Vec_IntEntry(vCube,iLit);
        iCube = Vec_IntEntry(vNums,iCiVarBeg);
        pVVar1 = _v;
        iVar5 = Abc_LitNot(iCube);
        Vec_IntPush(pVVar1,iVar5);
        if (fReverse == 0) {
          pVVar2 = vSop[(long)iVar + -1];
          iVar5 = iVar4 + iCiVarBeg;
          iVar6 = Abc_LitIsCompl(iCube);
          Vec_StrWriteEntry(pVVar2,iVar5,((iVar6 != 0 ^ 0xffU) & 1) + 0x30);
        }
        else {
          pVVar2 = vSop[(long)iVar + -1];
          iVar5 = (iVar4 + nCap) - iCiVarBeg;
          iVar6 = Abc_LitIsCompl(iCube);
          Vec_StrWriteEntry(pVVar2,iVar5 + -1,((iVar6 != 0 ^ 0xffU) & 1) + 0x30);
        }
      }
      psVar3 = pSatClean[(long)iVar + 1];
      piVar8 = Vec_IntArray(_v);
      end = Vec_IntLimit(_v);
      iVar4 = sat_solver_addclause(psVar3,piVar8,end);
      if (iVar4 == 0) {
        (&local_100)[iVar] = 1;
        break;
      }
      if (iVar4 != 1) {
        __assert_fail("status == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                      ,0x3d3,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
      }
    }
    if ((local_100 != 0) || (fProfile != 0)) break;
  }
LAB_006e3fee:
  Vec_IntFree(vLits);
  Vec_IntFree(vNums);
  Vec_IntFree(vVars);
  Vec_IntFree(vLitsC[0]);
  Vec_IntFree(vCube);
  Vec_IntFree(_v);
  Cnf_DataFree(p_00);
  sat_solver_delete(pSatClean[1]);
  sat_solver_delete(s);
  sat_solver_delete((sat_solver *)vSop[1]);
  sat_solver_delete(pSatClean[0]);
  if ((local_100 != 0) && (fProfile != 0)) {
    __assert_fail("!fComplete[0] || !fComplete[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcClp.c"
                  ,0x3e4,"Vec_Str_t *Bmc_CollapseOneOld(Gia_Man_t *, int, int, int, int, int)");
  }
  if ((local_100 != 0) || (fProfile != 0)) {
    local_70 = vSop[(long)fProfile + -1];
    vSop[(long)fProfile + -1] = (Vec_Str_t *)0x0;
    if (1 < status) {
      iVar4 = Vec_StrSize(local_70);
      Bmc_CollapseIrredundantFull(local_70,iVar4 / (int)(nCap + 3),nCap);
    }
  }
  if (fVerbose != 0) {
    printf("Processed output with %d supp vars. ",(ulong)nCap);
    if (local_70 == (Vec_Str_t *)0x0) {
      printf("The resulting SOP exceeded %d cubes.\n",(ulong)(uint)nCubeLim);
    }
    else {
      iVar4 = Vec_StrSize(local_70);
      printf("The best cover contains %d cubes.\n",(long)iVar4 / (long)(int)(nCap + 3) & 0xffffffff,
             (long)iVar4 % (long)(int)(nCap + 3) & 0xffffffff);
    }
    Abc_PrintTime(1,"Onset  minterm",(abctime)fComplete);
    Abc_PrintTime(1,"Onset  expand ",Time[0][0]);
    Abc_PrintTime(1,"Offset minterm",Time[0][1]);
    Abc_PrintTime(1,"Offset expand ",Time[1][0]);
  }
  Vec_StrFreeP(&vRes);
  Vec_StrFreeP(vSop);
  return local_70;
}

Assistant:

Vec_Str_t * Bmc_CollapseOneOld( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose )
{
    int fVeryVerbose = fVerbose;
    int nVars = Gia_ManCiNum(p);
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( p, 8, 0, 0, 0, 0 );
    sat_solver * pSat[2]      = { (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0), (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0) };
    sat_solver * pSatClean[2] = { (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0), (sat_solver *)Cnf_DataWriteIntoSolver(pCnf, 1, 0) };
    Vec_Str_t * vSop[2]   = { Vec_StrAlloc(1000),  Vec_StrAlloc(1000)  }, * vRes = NULL;
    Vec_Int_t * vLitsC[2] = { Vec_IntAlloc(nVars), Vec_IntAlloc(nVars) };
    Vec_Int_t * vVars = Vec_IntAlloc( nVars );
    Vec_Int_t * vLits = Vec_IntAlloc( nVars );
    Vec_Int_t * vNums = Vec_IntAlloc( nVars );
    Vec_Int_t * vCube = Vec_IntAlloc( nVars );
    int n, v, iVar, iLit, iCiVarBeg, iCube = 0, Start, status;
    abctime clk = 0, Time[2][2] = {{0}};
    int fComplete[2] = {0};

    // collect CI variables
    iCiVarBeg = pCnf->nVars - nVars;// - 1;
    if ( fReverse )
        for ( v = nVars - 1; v >= 0; v-- )
            Vec_IntPush( vVars, iCiVarBeg + v );
    else
        for ( v = 0; v < nVars; v++ )
            Vec_IntPush( vVars, iCiVarBeg + v );

    // check that on-set/off-set is sat
    for ( n = 0; n < 2; n++ )
    {
        iLit = Abc_Var2Lit( 1, n ); // n=0 => F=1   n=1 => F=0
        status = sat_solver_solve( pSat[n], &iLit, &iLit + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            goto cleanup; // timeout
        if ( status == l_False )
        {
            Vec_StrClear( vSop[0] );
            Vec_StrPrintStr( vSop[0], n ? " 1\n" : " 0\n" );
            Vec_StrPush( vSop[0], '\0' );
            fComplete[0] = 1;
            goto cleanup; // const0/1
        }
        // start with all negative literals
        Vec_IntForEachEntry( vVars, iVar, v )
            Vec_IntPush( vLitsC[n], Abc_Var2Lit(iVar, 1) );
        // add literals to the solver
        status = sat_solver_addclause( pSat[n], &iLit, &iLit + 1 );
        assert( status );
        status = sat_solver_addclause( pSatClean[n], &iLit, &iLit + 1 );
        assert( status );
        // start cover
        Vec_StrPush( vSop[n], '\0' );
    }

    // compute cube pairs
    for ( iCube = 0; nCubeLim == 0 || iCube < nCubeLim; iCube++ )
    {
        for ( n = 0; n < 2; n++ )
        {
            if ( fVeryVerbose ) clk = Abc_Clock();
            // get the assignment
            if ( fCanon )
                status = Bmc_ComputeCanonical( pSat[n], vLitsC[n], vCube, nBTLimit );
            else
            {
                sat_solver_clean_polarity( pSat[n], Vec_IntArray(vVars), Vec_IntSize(vVars) );
                status = sat_solver_solve( pSat[n], NULL, NULL, 0, 0, 0, 0 );
            }
            if ( fVeryVerbose ) Time[n][0] += Abc_Clock() - clk;
            if ( status == l_Undef )
                goto cleanup; // timeout
            if ( status == l_False )
            {
                fComplete[n] = 1;
                break;
            }
            // collect values
            Vec_IntClear( vLits );
            Vec_IntClear( vLitsC[n] );
            Vec_IntForEachEntry( vVars, iVar, v )
            {
                iLit = Abc_Var2Lit(iVar, !sat_solver_var_value(pSat[n], iVar));
                Vec_IntPush( vLits, iLit );
                Vec_IntPush( vLitsC[n], iLit );
            }
            // expand the values
            if ( fVeryVerbose ) clk = Abc_Clock();
            status = Bmc_CollapseExpand( pSatClean[!n], pSat[n], vLits, vNums, vCube, nBTLimit, fCanon, -1 );
            if ( fVeryVerbose ) Time[n][1] += Abc_Clock() - clk;
            if ( status < 0 )
                goto cleanup; // timeout
            // collect cube
            Vec_StrPop( vSop[n] );
            Start = Vec_StrSize( vSop[n] );
            Vec_StrFillExtra( vSop[n], Start + nVars + 4, '-' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 0, ' ' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 1, (char)(n ? '0' : '1') );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 2, '\n' );
            Vec_StrWriteEntry( vSop[n], Start + nVars + 3, '\0' );
            Vec_IntClear( vCube );
            Vec_IntForEachEntry( vNums, iVar, v )
            {
                iLit = Vec_IntEntry( vLits, iVar );
                Vec_IntPush( vCube, Abc_LitNot(iLit) );
                if ( fReverse )
                    Vec_StrWriteEntry( vSop[n], Start + nVars - iVar - 1, (char)('0' + !Abc_LitIsCompl(iLit)) );
                else 
                    Vec_StrWriteEntry( vSop[n], Start + iVar, (char)('0' + !Abc_LitIsCompl(iLit)) );
            }
            // add cube
            status = sat_solver_addclause( pSat[n], Vec_IntArray(vCube), Vec_IntLimit(vCube) );
            if ( status == 0 )
            {
                fComplete[n] = 1;
                break;
            }
            assert( status == 1 );
        }
        if ( fComplete[0] || fComplete[1] )
            break;
    }
cleanup:
    Vec_IntFree( vVars );
    Vec_IntFree( vLits );
    Vec_IntFree( vLitsC[0] );
    Vec_IntFree( vLitsC[1] );
    Vec_IntFree( vNums );
    Vec_IntFree( vCube );
    Cnf_DataFree( pCnf );
    sat_solver_delete( pSat[0] );
    sat_solver_delete( pSat[1] );
    sat_solver_delete( pSatClean[0] );
    sat_solver_delete( pSatClean[1] );
    assert( !fComplete[0] || !fComplete[1] );
    if ( fComplete[0] || fComplete[1] ) // one of the cover is computed
    {
        vRes = vSop[fComplete[1]]; vSop[fComplete[1]] = NULL;
        if ( iCube > 1 )
//            Bmc_CollapseIrredundant( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
            Bmc_CollapseIrredundantFull( vRes, Vec_StrSize(vRes)/(nVars +3), nVars );
    }
    if ( fVeryVerbose )
    {
        int fProfile = 0;
        printf( "Processed output with %d supp vars. ", nVars );
        if ( vRes == NULL )
            printf( "The resulting SOP exceeded %d cubes.\n", nCubeLim );
        else 
            printf( "The best cover contains %d cubes.\n", Vec_StrSize(vRes)/(nVars +3) );
        Abc_PrintTime( 1, "Onset  minterm", Time[0][0] );
        Abc_PrintTime( 1, "Onset  expand ", Time[0][1] );
        Abc_PrintTime( 1, "Offset minterm", Time[1][0] );
        Abc_PrintTime( 1, "Offset expand ", Time[1][1] );
        if ( fProfile )
        {
            Abc_PrintTime( 1, "Expand check1 ", clkCheck1 ); clkCheck1 = 0;
            Abc_PrintTime( 1, "Expand check2 ", clkCheck2 ); clkCheck2 = 0;
            Abc_PrintTime( 1, "Expand sat    ", clkCheckS ); clkCheckS = 0;
            Abc_PrintTime( 1, "Expand unsat  ", clkCheckU ); clkCheckU = 0;
        }
    }
    Vec_StrFreeP( &vSop[0] );
    Vec_StrFreeP( &vSop[1] );
    return vRes;
}